

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(FileMetaData *a,FileMetaData *b)

{
  _FileMetaData__isset _Var1;
  int32_t iVar2;
  int64_t iVar3;
  
  iVar2 = a->version;
  a->version = b->version;
  b->version = iVar2;
  std::swap<duckdb::vector<duckdb_parquet::SchemaElement,true>>(&a->schema,&b->schema);
  iVar3 = a->num_rows;
  a->num_rows = b->num_rows;
  b->num_rows = iVar3;
  std::swap<duckdb::vector<duckdb_parquet::RowGroup,true>>(&a->row_groups,&b->row_groups);
  std::swap<duckdb::vector<duckdb_parquet::KeyValue,true>>
            (&a->key_value_metadata,&b->key_value_metadata);
  std::__cxx11::string::swap((string *)&a->created_by);
  std::swap<duckdb::vector<duckdb_parquet::ColumnOrder,true>>(&a->column_orders,&b->column_orders);
  swap(&a->encryption_algorithm,&b->encryption_algorithm);
  std::__cxx11::string::swap((string *)&a->footer_signing_key_metadata);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(FileMetaData &a, FileMetaData &b) {
  using ::std::swap;
  swap(a.version, b.version);
  swap(a.schema, b.schema);
  swap(a.num_rows, b.num_rows);
  swap(a.row_groups, b.row_groups);
  swap(a.key_value_metadata, b.key_value_metadata);
  swap(a.created_by, b.created_by);
  swap(a.column_orders, b.column_orders);
  swap(a.encryption_algorithm, b.encryption_algorithm);
  swap(a.footer_signing_key_metadata, b.footer_signing_key_metadata);
  swap(a.__isset, b.__isset);
}